

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCall.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::FunctionCall::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionCall *this,int level)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  pointer pFVar5;
  allocator local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0 [39];
  allocator local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288 [32];
  reference local_268;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *argument;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  int local_1c;
  FunctionCall *pFStack_18;
  int level_local;
  FunctionCall *this_local;
  
  local_1c = level;
  pFStack_18 = this;
  this_local = (FunctionCall *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar3 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,uVar3,'\t',&local_1e9);
  std::operator+(&local_1c8,&local_1e8,"FunctionCall ");
  poVar4 = std::operator<<(local_198,(string *)&local_1c8);
  poVar4 = std::operator<<(poVar4,(string *)&this->name);
  poVar4 = std::operator<<(poVar4," {");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  if ((this->late_call & 1U) != 0) {
    iVar2 = local_1c + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_240,(long)iVar2,'\t',(allocator *)((long)&__range1 + 7));
    std::operator+(&local_220,&local_240,"LATE CALL");
    poVar4 = std::operator<<(local_198,(string *)&local_220);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ::begin(&this->arguments);
  argument = (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
              *)std::
                vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                ::end(&this->arguments);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>_>
                                     *)&argument), bVar1) {
    local_268 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>_>
                ::operator*(&__end1);
    pFVar5 = std::
             unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ::operator->(local_268);
    (*(pFVar5->super_ASTElement)._vptr_ASTElement[3])(local_288,pFVar5,(ulong)(local_1c + 1));
    poVar4 = std::operator<<(local_198,local_288);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_288);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->outer_argument);
  if (bVar1) {
    iVar2 = local_1c + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,(long)iVar2,'\t',&local_2c9);
    std::operator+(&local_2a8,&local_2c8,"OuterArgument-> ");
    poVar4 = std::operator<<(local_198,(string *)&local_2a8);
    pFVar5 = std::
             unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ::operator->(&this->outer_argument);
    (*(pFVar5->super_ASTElement)._vptr_ASTElement[3])(local_2f0,pFVar5,(ulong)(local_1c + 1));
    poVar4 = std::operator<<(poVar4,local_2f0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2f0);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  }
  uVar3 = (ulong)local_1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,uVar3,'\t',&local_331);
  std::operator+(&local_310,&local_330,"}");
  poVar4 = std::operator<<(local_198,(string *)&local_310);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::FunctionCall::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "FunctionCall " << this->name << " {" << std::endl;
    if (this->late_call){
        s << std::string(level+1, '\t') + "LATE CALL" << std::endl;
    }
    for (auto& argument : arguments) {
        s << argument->dump(level+1) << std::endl;
    }
    if (this->outer_argument) {
        s << std::string(level+1, '\t') + "OuterArgument-> " << this->outer_argument->dump(level+1) << std::endl;
    }
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}